

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stream.cpp
# Opt level: O2

void __thiscall FBX::Stream::Stream(Stream *this,string *path)

{
  int __fd;
  char *pcVar1;
  runtime_error *prVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_d8;
  stat st;
  
  (this->path)._M_dataplus._M_p = (pointer)&(this->path).field_2;
  (this->path)._M_string_length = 0;
  (this->path).field_2._M_local_buf[0] = '\0';
  this->cursor = 0;
  pcVar1 = realpath((path->_M_dataplus)._M_p,(char *)0x0);
  if (pcVar1 == (char *)0x0) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&st,
                   "Failed to open file ",path);
    std::runtime_error::runtime_error(prVar2,(string *)&st);
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&st,pcVar1,(allocator<char> *)&bStack_d8);
  std::__cxx11::string::operator=((string *)this,(string *)&st);
  std::__cxx11::string::~string((string *)&st);
  free(pcVar1);
  memset(&st,0,0x90);
  stat((this->path)._M_dataplus._M_p,(stat *)&st);
  this->fileSize = st.st_size;
  __fd = open((this->path)._M_dataplus._M_p,0,0);
  if (__fd != -1) {
    pcVar1 = (char *)mmap((void *)0x0,this->fileSize,1,2,__fd,0);
    this->data = pcVar1;
    if (pcVar1 != (char *)0xffffffffffffffff) {
      return;
    }
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+(&bStack_d8,"Failed to map file ",path);
    std::runtime_error::runtime_error(prVar2,(string *)&bStack_d8);
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(&bStack_d8,"Failed to open file ",path);
  std::runtime_error::runtime_error(prVar2,(string *)&bStack_d8);
  __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Stream::Stream(const std::string &path) {
#if defined(__unix__) || defined(__APPLE__)
        char *temp = realpath(path.c_str(), nullptr);
        if (!temp)
            throw std::runtime_error("Failed to open file " + path);

        this->path = std::string(temp);
        free(temp);

        struct stat st{};
        stat(this->path.c_str(), &st);
        fileSize = st.st_size;
        int file = open(this->path.c_str(), O_RDONLY, 0);
        if (file == -1)
            throw std::runtime_error("Failed to open file " + path);

        data = static_cast<char *>(mmap(nullptr, fileSize, PROT_READ, MAP_PRIVATE, file, 0));
        if (data == MAP_FAILED)
            throw std::runtime_error("Failed to map file " + path);
#elif __WIN32__
        auto buffer = new char[512];
        GetFullPathName(path.c_str(), 512, buffer, nullptr);
        this->path = reinterpret_cast<const char *>(buffer);

        file = CreateFile(
                this->path.c_str(),
                GENERIC_READ,
                0,
                nullptr,
                OPEN_EXISTING,
                0,
                nullptr
        );
        if (!file)
            throw std::runtime_error("Failed to open file " + path);

        map = CreateFileMapping(file, nullptr, PAGE_READONLY, 0, 0, nullptr);
        if (!map) {
            CloseHandle(file);
            throw std::runtime_error("Failed to create file mapping " + path);
        }

        data = (char *) MapViewOfFile(map, FILE_MAP_READ, 0, 0, 0);
        if (!data) {
            CloseHandle(map);
            CloseHandle(file);
            throw std::runtime_error("Failed to memory map file " + path);
        }
#endif
    }